

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O0

uint64_t quicly_decode64(uint8_t **src)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint64_t v;
  uint8_t **src_local;
  
  bVar1 = **src;
  bVar2 = (*src)[1];
  bVar3 = (*src)[2];
  bVar4 = (*src)[3];
  bVar5 = (*src)[4];
  bVar6 = (*src)[5];
  bVar7 = (*src)[6];
  bVar8 = (*src)[7];
  *src = *src + 8;
  return (ulong)bVar1 << 0x38 | (ulong)bVar2 << 0x30 | (ulong)bVar3 << 0x28 | (ulong)bVar4 << 0x20 |
         (ulong)bVar5 << 0x18 | (ulong)bVar6 << 0x10 | (ulong)bVar7 << 8 | (ulong)bVar8;
}

Assistant:

inline uint64_t quicly_decode64(const uint8_t **src)
{
    uint64_t v = (uint64_t)(*src)[0] << 56 | (uint64_t)(*src)[1] << 48 | (uint64_t)(*src)[2] << 40 | (uint64_t)(*src)[3] << 32 |
                 (uint64_t)(*src)[4] << 24 | (uint64_t)(*src)[5] << 16 | (uint64_t)(*src)[6] << 8 | (*src)[7];
    *src += 8;
    return v;
}